

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_results_in_the_edition_being_unchanged_Test
::TestBody(SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_results_in_the_edition_being_unchanged_Test
           *this)

{
  byte bVar1;
  bool bVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  SubjectSetRegister subject_register;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  AssertHelper local_1c0;
  internal local_1b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  undefined1 local_178 [112];
  SubjectSetRegister local_108 [48];
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  local_d8 [48];
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  local_a8 [48];
  _Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> local_78;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_108);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&local_190,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_108,&local_190,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_190);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset(&local_78)
  ;
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_108);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&local_1a8,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_108,&local_1a8,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  bVar1 = bidfx_public_api::price::pixie::SubscriptionSync::IsChangedEdition();
  local_1b8[0] = (internal)(bVar1 ^ 1);
  local_1b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)local_178);
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_178,local_1b8,
               (AssertionResult *)"subject_register.NextSubscriptionSync()->IsChangedEdition()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x2ad,(char *)local_178._0_8_);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_1c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_1c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1c8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  ::~_Rb_tree(local_a8);
  std::
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  ::~_Rb_tree(local_d8);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_after_RFQ_toggle_only_results_in_the_edition_being_unchanged)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    subject_register.NextSubscriptionSync();

    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    EXPECT_FALSE(subject_register.NextSubscriptionSync()->IsChangedEdition());
}